

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
* trial::dynamic::convert::
  overloader<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
         *__return_storage_ptr__,basic_variable<std::allocator<char>_> *map,error_code *error)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var2;
  bool bVar3;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  *this;
  const_reference self;
  pointer self_00;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
  result;
  const_iterator it;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
  _Stack_b8;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  undefined1 local_48 [24];
  
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_b8._M_impl.super__Rb_tree_header._M_header;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_48,map,true);
  do {
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     *)local_88,map,false);
    bVar3 = basic_variable<std::allocator<char>_>::
            iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      *)local_48,(const_iterator *)local_88);
    detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                *)(local_88 + 8));
    if (bVar3) {
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                  *)(local_48 + 8));
      p_Var4 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = &_Stack_b8._M_impl;
      if (_Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl;
        _Var5 = _S_red;
        p_Var6 = p_Var4;
      }
      else {
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var4;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
             _Stack_b8._M_impl.super__Rb_tree_header._M_node_count;
        _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var1 = &_Stack_b8._M_impl.super__Rb_tree_header;
        p_Var4 = _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var6 = _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_right;
        _Var5 = _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_color;
        _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
      (p_Var2->super__Rb_tree_header)._M_node_count = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var5;
LAB_0011df03:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>_>
      ::~_Rb_tree(&_Stack_b8);
      return __return_storage_ptr__;
    }
    this = (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            *)basic_variable<std::allocator<char>_>::
              iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            *)local_48);
    bVar3 = detail::
            small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ::
            call<trial::dynamic::basic_variable<std::allocator<char>>::similar_visitor<std::__cxx11::u32string>,bool>
                      (this);
    if (!bVar3) {
      if (error_category()::instance == '\0') {
        overloader<std::map<std::__cxx11::string,std::__cxx11::u32string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::u32string>>>,trial::dynamic::basic_variable<std::allocator<char>>,void>
        ::into();
      }
      error->_M_value = 1;
      error->_M_cat = (error_category *)&error_category()::instance;
LAB_0011deab:
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                  *)(local_48 + 8));
      goto LAB_0011df03;
    }
    self = basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::key((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_48);
    detail::
    overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,self,
              error);
    self_00 = basic_variable<std::allocator<char>_>::
              iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                            *)local_48);
    detail::
    overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_void>
    ::convert(&local_68,self_00,error);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::u32string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::u32string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::u32string>>>
    ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::u32string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::u32string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::u32string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::u32string>>>
                *)&_Stack_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               &local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
    }
    if (error->_M_value != 0) goto LAB_0011deab;
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_48);
  } while( true );
}

Assistant:

static std::map<Key, Value> into(const basic_variable<Allocator>& map,
                                     std::error_code& error)
    {
        std::map<Key, Value> result;
        for (auto it = map.begin(); it != map.end(); ++it)
        {
            if (it->template is<Value>())
                result.emplace(it.key().template value<Key>(error),
                               it->template value<Value>(error));
            else
                error = dynamic::make_error_code(incompatible_type);

            if (error)
                return {};
        }
        return result;
    }